

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel.cpp
# Opt level: O3

void __thiscall
TPZGraphEl::DrawSolutionT<std::complex<double>>
          (TPZGraphEl *this,TPZGraphNode *n,TPZVec<int> *solind,TPZDrawStyle st)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  long *plVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int incr;
  TPZManVector<int,_3> co;
  TPZManVector<double,_4> qsi;
  uint local_1cc;
  long local_1c8;
  int64_t local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  long local_1a8;
  TPZManVector<int,_3> local_1a0;
  TPZVec<double> local_170;
  double adStack_150 [4];
  TPZManVector<double,_4> local_130;
  undefined8 local_f0;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0 [20];
  
  uVar2 = (*(this->super_TPZSavable)._vptr_TPZSavable[9])();
  if (0 < (int)uVar2) {
    uVar10 = 0;
    do {
      iVar3 = (*(this->super_TPZSavable)._vptr_TPZSavable[0xd])(this,uVar10);
      if ((TPZGraphNode *)CONCAT44(extraout_var,iVar3) == n) goto LAB_0128f052;
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  uVar10 = 0;
LAB_0128f052:
  iVar4 = (*(this->super_TPZSavable)._vptr_TPZSavable[0x11])(this);
  local_f0 = (undefined **)((ulong)local_f0._4_4_ << 0x20);
  TPZManVector<int,_3>::TPZManVector(&local_1a0,(long)iVar4,(int *)&local_f0);
  local_1b8 = uVar10;
  (*(this->super_TPZSavable)._vptr_TPZSavable[0x14])(this,uVar10 & 0xffffffff,&local_1a0,&local_1cc)
  ;
  iVar3 = this->fGraphMesh->fResolution;
  local_1c0 = solind->fNElements;
  uVar2 = (*(this->super_TPZSavable)._vptr_TPZSavable[0xe])(this,n);
  local_f0 = (undefined **)0x0;
  TPZManVector<double,_4>::TPZManVector(&local_130,(long)iVar4,(double *)&local_f0);
  TPZVec<double>::TPZVec(&local_170,0);
  local_170.fStore = adStack_150;
  local_170._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b960;
  local_170.fNElements = 4;
  local_170.fNAlloc = 0;
  adStack_150[0] = 0.0;
  adStack_150[1] = 0.0;
  adStack_150[2] = 0.0;
  lVar9 = 0;
  adStack_150[3] = 0.0;
  local_f0 = &PTR__TPZManVector_01819110;
  memset(local_d0,0,0xa0);
  local_e0 = 6;
  local_d8 = 0;
  do {
    *(undefined8 *)((long)local_d0 + lVar9) = 0;
    *(undefined8 *)((long)local_d0 + lVar9 + 8) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x60);
  local_e8 = local_d0;
  local_1c8 = TPZGraphNode::FirstPoint(n);
  if (0 < (int)uVar2) {
    uVar10 = 0;
    do {
      (*(this->super_TPZSavable)._vptr_TPZSavable[0x16])
                (this,&local_1a0,(ulong)(uint)(1 << ((byte)iVar3 & 0x1f)),&local_130);
      if (st - EMVStyle < 2) {
        poVar6 = std::ostream::_M_insert<long>((long)&this->fGraphMesh->fOutFile);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        local_1c8 = local_1c8 + 1;
      }
      if (0 < local_1c0) {
        lVar9 = 0;
        local_1b0 = uVar10;
        do {
          (**(code **)(*(long *)this->fCompEl + 0x1b8))
                    (this->fCompEl,&local_130,solind->fStore[lVar9],&local_f0);
          plVar7 = (long *)(**(code **)(*(long *)this->fCompEl + 0xb8))();
          uVar5 = (**(code **)(*plVar7 + 0x88))(plVar7,solind->fStore[lVar9]);
          uVar8 = 9;
          if ((int)uVar5 < 9) {
            uVar8 = uVar5;
          }
          if (st != EVTKStyle) {
            uVar8 = uVar5;
          }
          local_1a8 = lVar9;
          if ((int)uVar8 < 1) {
            uVar5 = 0;
LAB_0128f311:
            if ((st == EVTKStyle) && ((uVar8 != 1 && (uVar5 < 3)))) {
              iVar4 = uVar5 - 3;
              do {
                poVar6 = std::ostream::_M_insert<double>(0.0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                iVar4 = iVar4 + 1;
              } while (iVar4 != 0);
            }
          }
          else {
            lVar9 = 0;
            do {
              poVar6 = std::ostream::_M_insert<double>
                                 ((double)(~-(ulong)(ABS(*(double *)((long)local_e8 + lVar9)) <
                                                    1e-20) &
                                          (ulong)*(double *)((long)local_e8 + lVar9)));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              lVar9 = lVar9 + 0x10;
            } while ((ulong)uVar8 << 4 != lVar9);
            uVar5 = uVar8;
            if ((1 < st - EMVStyle) || (uVar8 != 2)) goto LAB_0128f311;
            poVar6 = std::ostream::_M_insert<double>(0.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          }
          lVar9 = local_1a8 + 1;
          uVar10 = local_1b0;
        } while (lVar9 != local_1c0);
      }
      cVar1 = (char)this->fGraphMesh + -0x78;
      std::ios::widen((char)*(undefined8 *)(*(long *)&this->fGraphMesh->fOutFile + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      (*(this->super_TPZSavable)._vptr_TPZSavable[0x15])(this,local_1b8,&local_1a0,(ulong)local_1cc)
      ;
      uVar8 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar8;
    } while (uVar8 != uVar2);
  }
  if (local_e8 != local_d0) {
    local_d8 = 0;
    local_f0 = &PTR__TPZVec_01819178;
    if (local_e8 != (undefined8 *)0x0) {
      operator_delete__(local_e8);
    }
  }
  if (local_170.fStore != adStack_150) {
    local_170.fNAlloc = 0;
    local_170._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_170.fStore != (double *)0x0) {
      operator_delete__(local_170.fStore);
    }
  }
  if (local_130.super_TPZVec<double>.fStore != local_130.fExtAlloc) {
    local_130.super_TPZVec<double>.fNAlloc = 0;
    local_130.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_130.super_TPZVec<double>.fStore != (double *)0x0) {
      operator_delete__(local_130.super_TPZVec<double>.fStore);
    }
  }
  if (local_1a0.super_TPZVec<int>.fStore != local_1a0.fExtAlloc) {
    local_1a0.super_TPZVec<int>.fNAlloc = 0;
    local_1a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_1a0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_1a0.super_TPZVec<int>.fStore);
    }
  }
  return;
}

Assistant:

void TPZGraphEl::DrawSolutionT(TPZGraphNode *n,TPZVec<int> &solind,TPZDrawStyle st)
{
	int in = ConnectNum(n);
	//int i,j,incr;
	int incr;
    int dim = Dimension();
	TPZManVector<int,3> co(dim,0);
	FirstIJ(in,co,incr);
	//	ComputeSequence(n, ibound, incr);
	int res = fGraphMesh->Res();
	int imax;
	int64_t numsol = solind.NElements();
	int numvar;
	imax = 1 << res;
	int np = NPoints(n);
	int point=0;
	TPZManVector<REAL,4> qsi(dim,0.),x(4,0.);
	TPZManVector<TVar,10> sol(6,0.);
	int64_t ip = n->FirstPoint();
	while(point < np) 
	{
		QsiEta(co,imax,qsi);
		if(st == EMVStyle || st == EV3DStyle) fGraphMesh->Out() << ip++ << " ";
		for(int64_t is=0; is<numsol; is++) 
		{
			fCompEl->Solution(qsi,solind[is],sol);
			numvar = fCompEl->Material()->NSolutionVariables(solind[is]);
			if(st == EVTKStyle)
			{
				if(numvar > 9) numvar = 9; // Because it 3x3 tensor variables
			}
			int iv;
			for(iv=0; iv<numvar;iv++)
			{
				auto solprint = [&sol,iv](){
					if constexpr (std::is_same_v<TVar, RTVar>) {
						return sol[iv];
					} else {
						return std::real(sol[iv]);
					}
				}();
				
				if (fabs(solprint) < 1.0e-20)
					{solprint = 0.0;}
				fGraphMesh->Out() << solprint << " ";
			}
			if ((st == EMVStyle || st == EV3DStyle) && numvar == 2)
				{fGraphMesh->Out() << 0. << " ";}
			if(st == EVTKStyle && numvar != 1){
				for(; iv<3; iv++) fGraphMesh->Out() << 0. << " ";
			}
		}
		fGraphMesh->Out() << endl;
		NextIJ(in,co,incr);
		point++;
	}
}